

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

QSize __thiscall QCalendarWidget::minimumSizeHint(QCalendarWidget *this)

{
  long lVar1;
  QCalendarModel *this_00;
  undefined8 uVar2;
  QLocale QVar3;
  bool bVar4;
  int iVar5;
  DayOfWeek DVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  QStyle *pQVar10;
  QHeaderView *pQVar11;
  int extraout_var;
  int iVar12;
  DayOfWeek day;
  int extraout_EDX;
  uint extraout_EDX_00;
  int extraout_EDX_01;
  int iVar13;
  QSize QVar14;
  int i;
  int iVar15;
  FormatType FVar16;
  long in_FS_OFFSET;
  QMargins QVar17;
  QByteArrayView QVar18;
  QFontMetrics fm_3;
  QFontMetrics fm;
  QStyleOption option;
  int local_108;
  int local_104;
  int local_f4;
  QLocale local_c8;
  undefined1 *local_c0;
  QLocale local_b8;
  char16_t *pcStack_b0;
  undefined1 *local_a8;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QPalettePrivate *pQStack_70;
  undefined1 *local_68;
  QObject *pQStack_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if ((*(int *)(lVar1 + 0x2d4) < 0) || (*(int *)(lVar1 + 0x2d8) < 0)) {
    QWidget::ensurePolished(&this->super_QWidget);
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_60 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_70 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    iVar15 = 1;
    QStyleOption::QStyleOption((QStyleOption *)&local_98,1,0);
    QStyleOption::initFrom((QStyleOption *)&local_98,&this->super_QWidget);
    pQVar10 = QWidget::style(&this->super_QWidget);
    iVar5 = (**(code **)(*(long *)pQVar10 + 0xe0))(pQVar10,0x41,(QStyleOption *)&local_98);
    iVar5 = iVar5 * 2 + 2;
    if (*(int *)(*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600) + 0x44) == 0) {
      local_108 = 0;
      local_f4 = 6;
      iVar13 = 0;
    }
    else {
      iVar13 = 0;
      local_108 = 0;
      do {
        local_c0 = &DAT_aaaaaaaaaaaaaaaa;
        QtPrivate::QCalendarModel::formatForCell
                  ((QTextCharFormat *)&local_b8,*(QCalendarModel **)(lVar1 + 600),0,iVar15);
        QTextCharFormat::font();
        QFontMetrics::QFontMetrics((QFontMetrics *)&local_c0,(QFont *)&local_58);
        QFont::~QFont((QFont *)&local_58);
        QTextFormat::~QTextFormat((QTextFormat *)&local_b8);
        this_00 = *(QCalendarModel **)(lVar1 + 600);
        day = Sunday;
        if ((uint)(iVar15 - this_00->m_firstColumn) < 7) {
          iVar12 = this_00->m_firstDay - this_00->m_firstColumn;
          DVar6 = iVar15 + iVar12;
          day = iVar15 + -7 + iVar12;
          if ((int)DVar6 < 8) {
            day = DVar6;
          }
        }
        QtPrivate::QCalendarModel::dayName(&local_58,this_00,day);
        iVar7 = QFontMetrics::horizontalAdvance((QString *)&local_c0,(int)&local_58);
        iVar12 = iVar7 + iVar5;
        if (iVar7 + iVar5 < iVar13) {
          iVar12 = iVar13;
        }
        iVar13 = iVar12;
        if ((QLocale)local_58.d.d != (QLocale)0x0) {
          LOCK();
          *(int *)local_58.d.d = *(int *)local_58.d.d + -1;
          UNLOCK();
          if (*(int *)local_58.d.d == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
          }
        }
        iVar12 = QFontMetrics::height();
        if (iVar12 < local_108) {
          iVar12 = local_108;
        }
        local_108 = iVar12;
        QFontMetrics::~QFontMetrics((QFontMetrics *)&local_c0);
        iVar15 = iVar15 + 1;
      } while (iVar15 != 8);
      local_f4 = 7;
    }
    if (*(char *)(*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600) + 0x48) == '\0') {
      local_104 = 7;
    }
    else {
      iVar15 = 1;
      do {
        local_c0 = &DAT_aaaaaaaaaaaaaaaa;
        QtPrivate::QCalendarModel::formatForCell
                  ((QTextCharFormat *)&local_b8,*(QCalendarModel **)(lVar1 + 600),iVar15,0);
        QTextCharFormat::font();
        QFontMetrics::QFontMetrics((QFontMetrics *)&local_c0,(QFont *)&local_58);
        QFont::~QFont((QFont *)&local_58);
        QTextFormat::~QTextFormat((QTextFormat *)&local_b8);
        iVar12 = 1;
        do {
          iVar7 = (int)(QFont *)&local_58;
          QString::number(iVar7,iVar12);
          iVar8 = QFontMetrics::horizontalAdvance((QString *)&local_c0,iVar7);
          iVar7 = iVar8 + iVar5;
          if (iVar8 + iVar5 < iVar13) {
            iVar7 = iVar13;
          }
          iVar13 = iVar7;
          if ((QLocale)local_58.d.d != (QLocale)0x0) {
            LOCK();
            *(int *)local_58.d.d = *(int *)local_58.d.d + -1;
            UNLOCK();
            if (*(int *)local_58.d.d == 0) {
              QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
            }
          }
          iVar12 = iVar12 + 1;
        } while (iVar12 != 0x35);
        iVar12 = QFontMetrics::height();
        if (local_108 <= iVar12) {
          local_108 = iVar12;
        }
        QFontMetrics::~QFontMetrics((QFontMetrics *)&local_c0);
        iVar15 = iVar15 + 1;
      } while (iVar15 != 7);
      local_104 = 8;
    }
    local_c0 = &DAT_aaaaaaaaaaaaaaaa;
    iVar15 = 1;
    QtPrivate::QCalendarModel::formatForCell
              ((QTextCharFormat *)&local_b8,*(QCalendarModel **)(lVar1 + 600),1,1);
    QTextCharFormat::font();
    QFontMetrics::QFontMetrics((QFontMetrics *)&local_c0,(QFont *)&local_58);
    QFont::~QFont((QFont *)&local_58);
    QTextFormat::~QTextFormat((QTextFormat *)&local_b8);
    do {
      QString::number((int)&local_58,iVar15);
      iVar7 = QFontMetrics::horizontalAdvance((QString *)&local_c0,(int)&local_58);
      iVar12 = iVar7 + iVar5;
      if (iVar7 + iVar5 < iVar13) {
        iVar12 = iVar13;
      }
      iVar13 = iVar12;
      if ((QLocale)local_58.d.d != (QLocale)0x0) {
        LOCK();
        *(int *)local_58.d.d = *(int *)local_58.d.d + -1;
        UNLOCK();
        if (*(int *)local_58.d.d == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      iVar12 = QFontMetrics::height();
      if (iVar12 < local_108) {
        iVar12 = local_108;
      }
      local_108 = iVar12;
      iVar15 = iVar15 + 1;
    } while (iVar15 != 0x36);
    bVar4 = QTableView::showGrid(*(QTableView **)(lVar1 + 0x260));
    local_108 = local_108 + (uint)bVar4;
    iVar15 = iVar13 + (uint)bVar4 + 1;
    pQVar11 = QTableView::verticalHeader(*(QTableView **)(lVar1 + 0x260));
    iVar5 = QHeaderView::minimumSectionSize(pQVar11);
    if (local_108 <= iVar5) {
      local_108 = iVar5;
    }
    pQVar11 = QTableView::horizontalHeader(*(QTableView **)(lVar1 + 0x260));
    iVar5 = QHeaderView::minimumSectionSize(pQVar11);
    if (iVar5 < iVar15) {
      iVar5 = iVar15;
    }
    iVar13 = 0;
    iVar15 = 0;
    if (*(char *)(lVar1 + 0x2d0) != '\0') {
      (**(code **)(**(long **)(lVar1 + 0x2c0) + 0x70))();
      iVar15 = (**(code **)(**(long **)(lVar1 + 0x290) + 0x70))();
      iVar13 = (**(code **)(**(long **)(lVar1 + 0x288) + 0x70))();
      local_c8 = (QLocale)&DAT_aaaaaaaaaaaaaaaa;
      QFontMetrics::QFontMetrics
                ((QFontMetrics *)&local_c8,
                 (QFont *)(*(long *)(*(long *)(lVar1 + 0x298) + 0x20) + 0x38));
      iVar12 = 0;
      FVar16 = ShortFormat;
      do {
        local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        uVar2 = *(undefined8 *)(lVar1 + 600);
        QWidget::locale(&local_b8,&this->super_QWidget);
        QCalendar::standaloneMonthName((QLocale *)&local_58,(int)uVar2 + 0x18,(int)&local_b8,FVar16)
        ;
        QLocale::~QLocale(&local_b8);
        iVar7 = QFontMetrics::boundingRect((QString *)&local_c8);
        iVar7 = (extraout_EDX - iVar7) + 1;
        if (iVar7 < iVar12) {
          iVar7 = iVar12;
        }
        iVar12 = iVar7;
        if ((QLocale)local_58.d.d != (QLocale)0x0) {
          LOCK();
          *(int *)local_58.d.d = *(int *)local_58.d.d + -1;
          UNLOCK();
          if (*(int *)local_58.d.d == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
          }
        }
        FVar16 = FVar16 + ShortFormat;
      } while (FVar16 != 0xc);
      iVar7 = (**(code **)(**(long **)(lVar1 + 0x298) + 0x70))();
      QAbstractButton::text(&local_58,*(QAbstractButton **)(lVar1 + 0x298));
      iVar8 = QFontMetrics::boundingRect((QString *)&local_c8);
      if ((QLocale)local_58.d.d != (QLocale)0x0) {
        LOCK();
        *(int *)local_58.d.d = *(int *)local_58.d.d + -1;
        UNLOCK();
        if (*(int *)local_58.d.d == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      QFontMetrics::QFontMetrics
                ((QFontMetrics *)&local_58,
                 (QFont *)(*(long *)(*(long *)(lVar1 + 0x2b0) + 0x20) + 0x38));
      QVar3 = local_c8;
      local_c8 = (QLocale)local_58.d.d;
      local_58.d.d = (Data *)QVar3;
      QFontMetrics::~QFontMetrics((QFontMetrics *)&local_58);
      QVar18.m_data = (storage_type *)0x4;
      QVar18.m_size = (qsizetype)&local_58;
      QString::fromLatin1(QVar18);
      local_b8 = (QLocale)local_58.d.d;
      pcStack_b0 = local_58.d.ptr;
      local_a8 = (undefined1 *)local_58.d.size;
      iVar9 = QFontMetrics::boundingRect((QString *)&local_c8);
      if (local_b8 != (QLocale)0x0) {
        LOCK();
        *(int *)local_b8 = *(int *)local_b8 + -1;
        UNLOCK();
        if (*(int *)local_b8 == 0) {
          QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
        }
      }
      iVar13 = ((iVar15 + iVar13 + iVar12 + (~extraout_EDX_00 + iVar8 + iVar7) * 2 + extraout_EDX_01
                ) - iVar9) + 1;
      QFontMetrics::~QFontMetrics((QFontMetrics *)&local_c8);
      iVar15 = extraout_var;
    }
    iVar12 = iVar5 * local_104;
    if (iVar5 * local_104 < iVar13) {
      iVar12 = iVar13;
    }
    QVar17 = QWidget::contentsMargins(&this->super_QWidget);
    QVar14.wd.m_i = iVar12 + QVar17.m_right.m_i.m_i + QVar17.m_left.m_i.m_i;
    QVar14.ht.m_i = QVar17.m_bottom.m_i.m_i + iVar15 + QVar17.m_top.m_i.m_i + local_108 * local_f4;
    *(QSize *)(lVar1 + 0x2d4) = QVar14;
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_c0);
    QStyleOption::~QStyleOption((QStyleOption *)&local_98);
  }
  else {
    QVar14 = *(QSize *)(lVar1 + 0x2d4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar14;
  }
  __stack_chk_fail();
}

Assistant:

QSize QCalendarWidget::minimumSizeHint() const
{
    Q_D(const QCalendarWidget);
    if (d->cachedSizeHint.isValid())
        return d->cachedSizeHint;

    ensurePolished();

    int w = 0;
    int h = 0;

    int end = 53;
    int rows = 7;
    int cols = 8;

    QStyleOption option;
    option.initFrom(this);
    const int marginH = (style()->pixelMetric(QStyle::PM_FocusFrameHMargin, &option, this) + 1) * 2;

    if (horizontalHeaderFormat() == QCalendarWidget::NoHorizontalHeader) {
        rows = 6;
    } else {
        for (int i = 1; i <= 7; i++) {
            QFontMetrics fm(d->m_model->formatForCell(0, i).font());
            w = qMax(w, fm.horizontalAdvance(d->m_model->dayName(d->m_model->dayOfWeekForColumn(i))) + marginH);
            h = qMax(h, fm.height());
        }
    }

    if (verticalHeaderFormat() == QCalendarWidget::NoVerticalHeader) {
        cols = 7;
    } else {
        for (int i = 1; i <= 6; i++) {
            QFontMetrics fm(d->m_model->formatForCell(i, 0).font());
            for (int j = 1; j < end; j++)
                w = qMax(w, fm.horizontalAdvance(QString::number(j)) + marginH);
            h = qMax(h, fm.height());
        }
    }

    QFontMetrics fm(d->m_model->formatForCell(1, 1).font());
    for (int i = 1; i <= end; i++) {
        w = qMax(w, fm.horizontalAdvance(QString::number(i)) + marginH);
        h = qMax(h, fm.height());
    }

    if (d->m_view->showGrid()) {
        // hardcoded in tableview
        w += 1;
        h += 1;
    }

    w += 1; // default column span

    h = qMax(h, d->m_view->verticalHeader()->minimumSectionSize());
    w = qMax(w, d->m_view->horizontalHeader()->minimumSectionSize());

    //add the size of the header.
    QSize headerSize(0, 0);
    if (d->navBarVisible) {
        int headerH = d->navBarBackground->sizeHint().height();
        int headerW = 0;

        headerW += d->prevMonth->sizeHint().width();
        headerW += d->nextMonth->sizeHint().width();

        QFontMetrics fm = d->monthButton->fontMetrics();
        int monthW = 0;
        for (int i = 1; i < 12; i++) {
            QString monthName = d->m_model->monthName(locale(), i);
            monthW = qMax(monthW, fm.boundingRect(monthName).width());
        }
        const int buttonDecoMargin = d->monthButton->sizeHint().width() - fm.boundingRect(d->monthButton->text()).width();
        headerW += monthW + buttonDecoMargin;

        fm = d->yearButton->fontMetrics();
        headerW += fm.boundingRect("5555"_L1).width() + buttonDecoMargin;

        headerSize = QSize(headerW, headerH);
    }
    w *= cols;
    w = qMax(headerSize.width(), w);
    h = (h * rows) + headerSize.height();
    QMargins cm = contentsMargins();
    w += cm.left() + cm.right();
    h += cm.top() + cm.bottom();
    d->cachedSizeHint = QSize(w, h);
    return d->cachedSizeHint;
}